

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_utf8.c
# Opt level: O0

char * cm_utf8_decode_character(char *first,char *last,uint *pc)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint local_34;
  uint local_30;
  int left;
  uint uc;
  uchar ones;
  uchar c;
  uint *pc_local;
  char *last_local;
  char *first_local;
  
  first_local = first + 1;
  bVar1 = *first;
  bVar2 = ""[bVar1];
  uVar3 = (uint)bVar2;
  if (uVar3 == 0) {
    *pc = (uint)bVar1;
  }
  else if ((uVar3 == 1) || (uVar3 - 7 < 2)) {
    first_local = (char *)0x0;
  }
  else {
    local_30 = (uint)(bVar1 & cm_utf8_mask[bVar2]);
    local_34 = (uint)bVar2;
    last_local = first_local;
    while (local_34 = local_34 - 1, local_34 != 0 && last_local != last) {
      if (""[(byte)*last_local] != '\x01') {
        return (char *)0x0;
      }
      local_30 = local_30 << 6 | (byte)*last_local & 0x3f;
      last_local = last_local + 1;
    }
    if (((int)local_34 < 1) && (cm_utf8_min[bVar2] <= local_30)) {
      *pc = local_30;
      first_local = last_local;
    }
    else {
      first_local = (char *)0x0;
    }
  }
  return first_local;
}

Assistant:

const char* cm_utf8_decode_character(const char* first, const char* last,
                                     unsigned int* pc)
{
  /* Count leading ones in the first byte.  */
  unsigned char c = (unsigned char)*first++;
  unsigned char const ones = cm_utf8_ones[c];
  switch (ones) {
    case 0:
      *pc = c;
      return first; /* One-byte character.  */
    case 1:
    case 7:
    case 8:
      return 0; /* Invalid leading byte.  */
    default:
      break;
  }

  /* Extract bits from this multi-byte character.  */
  {
    unsigned int uc = c & cm_utf8_mask[ones];
    int left;
    for (left = ones - 1; left && first != last; --left) {
      c = (unsigned char)*first++;
      if (cm_utf8_ones[c] != 1) {
        return 0;
      }
      uc = (uc << 6) | (c & cm_utf8_mask[1]);
    }

    if (left > 0 || uc < cm_utf8_min[ones]) {
      return 0;
    }

    *pc = uc;
    return first;
  }
}